

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>
::
List_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>>>>>>
          (List_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>
           *this,Index columnIndex,
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          *nonZeroRowIndices,Dimension dimension,
          vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>_>_>
          *rowContainer,Column_settings *colSettings)

{
  pointer ppVar1;
  _List_node_base *p_Var2;
  pair<unsigned_int,_unsigned_int> *p;
  pointer ppVar3;
  allocator_type local_45;
  uint local_44;
  List_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>
  *local_40;
  iterator local_38;
  
  *(Index *)this = columnIndex;
  *(vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>_>_>
    **)(this + 8) = rowContainer;
  local_40 = this + 0x10;
  std::__cxx11::
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_*>_>
  ::list((list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_*>_>
          *)local_40,
         (long)(nonZeroRowIndices->
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(nonZeroRowIndices->
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 3,&local_45);
  *(undefined1 **)(this + 0x30) = &colSettings->field_0x20;
  *(Column_settings **)(this + 0x28) = colSettings;
  ppVar1 = (nonZeroRowIndices->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_38._M_node = *(_List_node_base **)(this + 0x10);
  for (ppVar3 = (nonZeroRowIndices->
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
    local_44 = ppVar3->second;
    if (**(uint **)(this + 0x28) <= local_44) {
      local_44 = local_44 % **(uint **)(this + 0x28);
    }
    p_Var2 = (local_38._M_node)->_M_next;
    List_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
    ::_update_entry((List_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
                     *)this,&local_44,ppVar3->first,&local_38);
    local_38._M_node = p_Var2;
  }
  return;
}

Assistant:

inline List_column<Master_matrix>::List_column(Index columnIndex,
                                               const Container& nonZeroRowIndices,
                                               Dimension dimension,
                                               Row_container* rowContainer,
                                               Column_settings* colSettings)
    : RA_opt(columnIndex, rowContainer),
      Dim_opt(dimension),
      Chain_opt([&] {
        if constexpr (Master_matrix::Option_list::is_z2) {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : *std::prev(nonZeroRowIndices.end());
        } else {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : std::prev(nonZeroRowIndices.end())->first;
        }
      }()),
      column_(nonZeroRowIndices.size()),
      operators_(nullptr),
      entryPool_(&(colSettings->entryConstructor))
{
  auto it = column_.begin();
  if constexpr (Master_matrix::Option_list::is_z2) {
    for (ID_index id : nonZeroRowIndices) {
      _update_entry(id, it++);
    }
  } else {
    operators_ = &(colSettings->operators);
    for (const auto& p : nonZeroRowIndices) {
      _update_entry(operators_->get_value(p.second), p.first, it++);
    }
  }
}